

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainingLayers.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeTrainingLayers(ConvertLayerParameters layerParameters)

{
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  Type *pTVar4;
  ostream *poVar5;
  Type *pTVar6;
  mapped_type *pmVar7;
  long lVar8;
  void **ppvVar9;
  string input;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  int *in_stack_00000048;
  string local_50 [32];
  
  iVar1 = *in_stack_00000048;
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(input._M_dataplus._M_p + 0x70),iVar1);
  iVar2 = *(int *)(input._M_dataplus._M_p + 0x78);
  poVar5 = std::operator<<((ostream *)&std::cout,"WARNING: Skipping training related layer \'");
  poVar5 = std::operator<<(poVar5,(string *)(pTVar4->name_).ptr_);
  poVar5 = std::operator<<(poVar5,"\' of type \'");
  poVar5 = std::operator<<(poVar5,(string *)(pTVar4->type_).ptr_);
  poVar5 = std::operator<<(poVar5,"\'.");
  std::endl<char,std::char_traits<char>>(poVar5);
  if (((iVar1 != iVar2 + -1) && ((pTVar4->top_).super_RepeatedPtrFieldBase.current_size_ != 0)) &&
     ((pTVar4->bottom_).super_RepeatedPtrFieldBase.current_size_ != 0)) {
    lVar8 = 0;
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(pTVar4->bottom_).super_RepeatedPtrFieldBase,0);
    std::__cxx11::string::string(local_50,(string *)pTVar6);
    pRVar3 = (pTVar4->top_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar1 = (pTVar4->top_).super_RepeatedPtrFieldBase.current_size_;
    for (; (long)iVar1 * 8 != lVar8; lVar8 = lVar8 + 8) {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_stack_00000028,*(key_type **)((long)ppvVar9 + lVar8));
      std::__cxx11::string::_M_assign((string *)pmVar7);
    }
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void CoreMLConverter::convertCaffeTrainingLayers(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int numberOfLayers = layerParameters.prototxt.layer_size();
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    
    std::cout<< "WARNING: Skipping training related layer '" << caffeLayer.name() << "' of type '"
    << caffeLayer.type() << "'." << std::endl;
    
    if (layerId != numberOfLayers-1){
        if (caffeLayer.top_size() != 0 && caffeLayer.bottom_size() != 0) {
            std::string input = caffeLayer.bottom(0);
            for (const auto& output: caffeLayer.top()){
                mappingDataBlobNames[output] = input;
            }
        }
    }
}